

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
SimpleParallelSimulationDataGenerator::~SimpleParallelSimulationDataGenerator
          (SimpleParallelSimulationDataGenerator *this)

{
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&(this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
            );
  std::_Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>::
  ~_Vector_base(&(this->mData).
                 super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
               );
  SimulationChannelDescriptorGroup::~SimulationChannelDescriptorGroup(&this->mSimulationData);
  return;
}

Assistant:

SimpleParallelSimulationDataGenerator::~SimpleParallelSimulationDataGenerator()
{
}